

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError proto2num(OperationConfig *config,char **val,char **ostr,char *str)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  size_t __nmemb;
  size_t sVar6;
  char **ppcVar7;
  char *p_1;
  char buffer [32];
  ulong uStack_80;
  e_action action;
  size_t plen;
  char *next;
  char *p;
  long lStack_60;
  CURLcode result;
  size_t proto;
  dynbuf obuf;
  char **protoset;
  char *str_local;
  char **ostr_local;
  char **val_local;
  OperationConfig *config_local;
  
  curlx_dyn_init((dynbuf *)&proto,0x2c0);
  obuf.toobig = (size_t)malloc((proto_count + 1) * 8);
  if ((undefined8 *)obuf.toobig == (undefined8 *)0x0) {
    return PARAM_NO_MEM;
  }
  *(undefined8 *)obuf.toobig = 0;
  for (ostr_local = val; protoset = (char **)str, *ostr_local != (char *)0x0;
      ostr_local = ostr_local + 1) {
    pcVar3 = proto_token(*ostr_local);
    if (pcVar3 != (char *)0x0) {
      protoset_set((char **)obuf.toobig,pcVar3);
    }
  }
  while (*(char *)protoset != '\0') {
    ppcVar4 = (char **)strchr((char *)protoset,0x2c);
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    if (ppcVar4 == (char **)0x0) {
      uVar5 = strlen((char *)protoset);
LAB_0012287d:
      uStack_80 = uVar5 - 1;
      ppcVar7 = (char **)((long)protoset + 1);
      cVar1 = *(char *)protoset;
      if (cVar1 == '+') {
        buffer[0x1c] = '\0';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        uVar5 = uStack_80;
        protoset = ppcVar7;
      }
      else if (cVar1 == '-') {
        buffer[0x1c] = '\x01';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        uVar5 = uStack_80;
        protoset = ppcVar7;
      }
      else if (cVar1 == '=') {
        buffer[0x1c] = '\x02';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        uVar5 = uStack_80;
        protoset = ppcVar7;
      }
      uStack_80 = uVar5;
      if ((uStack_80 == 3) && (iVar2 = curl_strnequal(protoset,"all",3), iVar2 != 0)) {
        if (buffer._28_4_ == 0) {
LAB_0012293f:
          memcpy((void *)obuf.toobig,built_in_protos,(proto_count + 1) * 8);
        }
        else if (buffer._28_4_ == 1) {
          *(undefined8 *)obuf.toobig = 0;
        }
        else if (buffer._28_4_ == 2) goto LAB_0012293f;
      }
      else {
        curl_msnprintf(&p_1,0x20,"%.*s",uStack_80 & 0xffffffff,protoset);
        pcVar3 = proto_token((char *)&p_1);
        if (pcVar3 == (char *)0x0) {
          if (buffer._28_4_ == 2) {
            *(undefined8 *)obuf.toobig = 0;
          }
          warnf(config->global,"unrecognized protocol \'%s\'",&p_1);
        }
        else if (buffer._28_4_ == 0) {
LAB_001229f0:
          protoset_set((char **)obuf.toobig,pcVar3);
        }
        else if (buffer._28_4_ == 1) {
          protoset_clear((char **)obuf.toobig,pcVar3);
        }
        else if (buffer._28_4_ == 2) {
          *(undefined8 *)obuf.toobig = 0;
          goto LAB_001229f0;
        }
      }
      if (ppcVar4 == (char **)0x0) break;
      protoset = (char **)((long)ppcVar4 + 1);
    }
    else {
      if (protoset != ppcVar4) {
        uVar5 = (long)ppcVar4 - (long)protoset;
        goto LAB_0012287d;
      }
      protoset = (char **)((long)protoset + 1);
    }
  }
  sVar6 = obuf.toobig;
  __nmemb = protoset_index((char **)obuf.toobig,(char *)0x0);
  qsort((void *)sVar6,__nmemb,8,struplocompare4sort);
  p._4_4_ = curlx_dyn_addn((dynbuf *)&proto,"",0);
  lStack_60 = 0;
  while (*(long *)(obuf.toobig + lStack_60 * 8) != 0 && p._4_4_ == CURLE_OK) {
    p._4_4_ = curlx_dyn_addf((dynbuf *)&proto,"%s,",*(undefined8 *)(obuf.toobig + lStack_60 * 8));
    lStack_60 = lStack_60 + 1;
  }
  free((void *)obuf.toobig);
  sVar6 = curlx_dyn_len((dynbuf *)&proto);
  curlx_dyn_setlen((dynbuf *)&proto,sVar6 - 1);
  free(*ostr);
  pcVar3 = curlx_dyn_ptr((dynbuf *)&proto);
  *ostr = pcVar3;
  if (*ostr == (char *)0x0) {
    return PARAM_NO_MEM;
  }
  return PARAM_OK;
}

Assistant:

ParameterError proto2num(struct OperationConfig *config,
                         const char * const *val, char **ostr, const char *str)
{
  const char **protoset;
  struct curlx_dynbuf obuf;
  size_t proto;
  CURLcode result;

  curlx_dyn_init(&obuf, MAX_PROTOSTRING);

  protoset = malloc((proto_count + 1) * sizeof(*protoset));
  if(!protoset)
    return PARAM_NO_MEM;

  /* Preset protocol set with default values. */
  protoset[0] = NULL;
  for(; *val; val++) {
    const char *p = proto_token(*val);

    if(p)
      protoset_set(protoset, p);
  }

  while(*str) {
    const char *next = strchr(str, ',');
    size_t plen;
    enum e_action { allow, deny, set } action = allow;

    if(next) {
      if(str == next) {
        str++;
        continue;
      }
      plen = next - str - 1;
    }
    else
      plen = strlen(str) - 1;

    /* Process token modifiers */
    switch(*str++) {
    case '=':
      action = set;
      break;
    case '-':
      action = deny;
      break;
    case '+':
      action = allow;
      break;
    default:
      /* no modifier */
      str--;
      plen++;
      break;
    }

    if((plen == 3) && curl_strnequal(str, "all", 3)) {
      switch(action) {
      case deny:
        protoset[0] = NULL;
        break;
      case allow:
      case set:
        memcpy((char *) protoset,
               built_in_protos, (proto_count + 1) * sizeof(*protoset));
        break;
      }
    }
    else {
      char buffer[32];
      const char *p;
      msnprintf(buffer, sizeof(buffer), "%.*s", (int)plen, str);

      p = proto_token(buffer);

      if(p)
        switch(action) {
        case deny:
          protoset_clear(protoset, p);
          break;
        case set:
          protoset[0] = NULL;
          FALLTHROUGH();
        case allow:
          protoset_set(protoset, p);
          break;
        }
      else { /* unknown protocol */
        /* If they have specified only this protocol, we say treat it as
           if no protocols are allowed */
        if(action == set)
          protoset[0] = NULL;
        warnf(config->global, "unrecognized protocol '%s'", buffer);
      }
    }
    if(next)
      str = next + 1;
    else
      break;
  }

  /* We need the protocols in alphabetic order for CI tests requirements. */
  qsort((char *) protoset, protoset_index(protoset, NULL), sizeof(*protoset),
        struplocompare4sort);

  result = curlx_dyn_addn(&obuf, "", 0);
  for(proto = 0; protoset[proto] && !result; proto++)
    result = curlx_dyn_addf(&obuf, "%s,", protoset[proto]);
  free((char *) protoset);
  curlx_dyn_setlen(&obuf, curlx_dyn_len(&obuf) - 1);
  free(*ostr);
  *ostr = curlx_dyn_ptr(&obuf);

  return *ostr ? PARAM_OK : PARAM_NO_MEM;
}